

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::internal::
SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::~SchemaValidationContext
          (SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this)

{
  uint uVar1;
  ISchemaValidator **ppIVar2;
  ulong uVar3;
  
  if (this->hasher != (void *)0x0) {
    (*this->factory->_vptr_ISchemaStateFactory[6])();
  }
  ppIVar2 = this->validators;
  if (ppIVar2 != (ISchemaValidator **)0x0) {
    uVar1 = this->validatorCount;
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        if (this->validators[uVar3] != (ISchemaValidator *)0x0) {
          (*this->factory->_vptr_ISchemaStateFactory[3])();
          uVar1 = this->validatorCount;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar1);
      ppIVar2 = this->validators;
    }
    (*this->factory->_vptr_ISchemaStateFactory[8])(this->factory,ppIVar2);
  }
  ppIVar2 = this->patternPropertiesValidators;
  if (ppIVar2 != (ISchemaValidator **)0x0) {
    uVar1 = this->patternPropertiesValidatorCount;
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        if (this->patternPropertiesValidators[uVar3] != (ISchemaValidator *)0x0) {
          (*this->factory->_vptr_ISchemaStateFactory[3])();
          uVar1 = this->patternPropertiesValidatorCount;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar1);
      ppIVar2 = this->patternPropertiesValidators;
    }
    (*this->factory->_vptr_ISchemaStateFactory[8])(this->factory,ppIVar2);
  }
  if (this->patternPropertiesSchemas != (SchemaType **)0x0) {
    (*this->factory->_vptr_ISchemaStateFactory[8])();
  }
  if (this->propertyExist != (bool *)0x0) {
    (*this->factory->_vptr_ISchemaStateFactory[8])();
  }
  return;
}

Assistant:

~SchemaValidationContext() {
        if (hasher)
            factory.DestroryHasher(hasher);
        if (validators) {
            for (SizeType i = 0; i < validatorCount; i++) {
                if (validators[i]) {
                    factory.DestroySchemaValidator(validators[i]);
                }
            }
            factory.FreeState(validators);
        }
        if (patternPropertiesValidators) {
            for (SizeType i = 0; i < patternPropertiesValidatorCount; i++) {
                if (patternPropertiesValidators[i]) {
                    factory.DestroySchemaValidator(patternPropertiesValidators[i]);
                }
            }
            factory.FreeState(patternPropertiesValidators);
        }
        if (patternPropertiesSchemas)
            factory.FreeState(patternPropertiesSchemas);
        if (propertyExist)
            factory.FreeState(propertyExist);
    }